

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetRelErrFunc(void *kinmem,sunrealtype relfunc)

{
  double __x;
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x2ea;
  }
  else {
    dVar2 = 0.0;
    if (0.0 <= relfunc) {
      if ((relfunc != 0.0) || (NAN(relfunc))) {
        if (relfunc < 0.0) {
          dVar2 = sqrt(relfunc);
        }
        else {
          dVar2 = SQRT(relfunc);
        }
        *(double *)((long)kinmem + 0x88) = dVar2;
      }
      else {
        __x = *(double *)((long)kinmem + 8);
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar2 = sqrt(__x);
          }
          else {
            dVar2 = SQRT(__x);
          }
        }
        *(double *)((long)kinmem + 0x88) = dVar2;
      }
      return 0;
    }
    msgfmt = "relfunc < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
    line = 0x2f2;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetRelErrFunc",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetRelErrFunc(void* kinmem, sunrealtype relfunc)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (relfunc < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELFUNC);
    return (KIN_ILL_INPUT);
  }

  if (relfunc == ZERO)
  {
    uround                    = kin_mem->kin_uround;
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(uround);
  }
  else { kin_mem->kin_sqrt_relfunc = SUNRsqrt(relfunc); }

  return (KIN_SUCCESS);
}